

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O3

void __thiscall
Transaction_AddTxIn_RemoveTxIn_Test::~Transaction_AddTxIn_RemoveTxIn_Test
          (Transaction_AddTxIn_RemoveTxIn_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Transaction, AddTxIn_RemoveTxIn) {
  Transaction tx(exp_version, exp_locktime);

  Script script("1600141c673dd706e05b17e5c9ff033c8619d06098d7ac");
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "306186bd70e56d820508ed3c9fd656ecb4b4ead0b1502fc3349145df5a15b7e9"),
          1, 4294967294, script));
  EXPECT_EQ(tx.GetTxInCount(), 1);
  EXPECT_NO_THROW(tx.GetTxIn(0));

  EXPECT_NO_THROW(tx.RemoveTxIn(0));
  EXPECT_EQ(tx.GetTxInCount(), 0);
  EXPECT_THROW(tx.GetTxIn(0), CfdException);
}